

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::EnumValueOptions::_InternalSerialize
          (EnumValueOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  FeatureSet *value;
  FieldOptions_FeatureSupport *value_00;
  ulong uVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_01;
  int index;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 4) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteBoolToArray(1,(this->field_0)._impl_.deprecated_,puVar4)
    ;
  }
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                        stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteBoolToArray
                       (3,(this->field_0)._impl_.debug_redact_,puVar4);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = (this->field_0)._impl_.feature_support_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value_00,*(int *)((long)&value_00->field_0 + 4),target,
                        stream);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x28);
  for (index = 0; iVar2 != index; index = index + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                         (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase,
                          index);
    target = internal::WireFormatLite::InternalWriteMessage
                       (999,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  puVar4 = internal::ExtensionSet::_InternalSerialize
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)&_EnumValueOptions_default_instance_,1000,0x20000000,target,
                      stream);
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return puVar4;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),puVar4,stream);
  return puVar4;
}

Assistant:

::uint8_t* EnumValueOptions::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const EnumValueOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumValueOptions)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          cached_has_bits = this_._impl_._has_bits_[0];
          // optional bool deprecated = 1 [default = false];
          if (cached_has_bits & 0x00000004u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                1, this_._internal_deprecated(), target);
          }

          // optional .google.protobuf.FeatureSet features = 2;
          if (cached_has_bits & 0x00000001u) {
            target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                2, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
                stream);
          }

          // optional bool debug_redact = 3 [default = false];
          if (cached_has_bits & 0x00000008u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                3, this_._internal_debug_redact(), target);
          }

          // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 4;
          if (cached_has_bits & 0x00000002u) {
            target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                4, *this_._impl_.feature_support_, this_._impl_.feature_support_->GetCachedSize(), target,
                stream);
          }

          // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
          for (unsigned i = 0, n = static_cast<unsigned>(
                                   this_._internal_uninterpreted_option_size());
               i < n; i++) {
            const auto& repfield = this_._internal_uninterpreted_option().Get(i);
            target =
                ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
                    999, repfield, repfield.GetCachedSize(),
                    target, stream);
          }

          // Extension range [1000, 536870912)
          target = this_._impl_._extensions_._InternalSerialize(
              internal_default_instance(), 1000, 536870912, target, stream);
          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumValueOptions)
          return target;
        }